

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

void __thiscall tonk::Connection::tonk_close(Connection *this)

{
  ErrorResult *pEVar1;
  Result local_40;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Application requested session end","");
  pEVar1 = (ErrorResult *)operator_new(0x38);
  pEVar1->Source = "Connection::tonk_close";
  (pEVar1->Description)._M_dataplus._M_p = (pointer)&(pEVar1->Description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pEVar1->Description,local_38,local_38 + local_30);
  pEVar1->Type = Tonk;
  pEVar1->Code = 0xc;
  local_40.Error = pEVar1;
  RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,0xc,&local_40);
  Result::~Result(&local_40);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void Connection::tonk_close()
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());

    // Begin disconnect if it has not happened yet
    SelfRefCount.StartShutdown(Tonk_AppRequest, Result("Connection::tonk_close", "Application requested session end", ErrorType::Tonk, Tonk_AppRequest));

    // The disconnection will complete on the timer tick green thread
}